

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayof.c
# Opt level: O2

void tommy_arrayof_grow(tommy_arrayof *array,tommy_count_t count)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  tommy_uint_t tVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array->count < count) {
    array->count = count;
    uVar2 = array->bucket_max;
    while (uVar2 < count) {
      pvVar3 = lrtr_calloc((ulong)uVar2,array->element_size);
      uVar2 = array->bucket_bit;
      array->bucket[uVar2] = (void *)((long)pvVar3 - (ulong)array->bucket_max * array->element_size)
      ;
      tVar4 = uVar2 + 1;
      array->bucket_bit = tVar4;
      uVar2 = 1 << ((byte)tVar4 & 0x1f);
      array->bucket_max = uVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayof_grow(tommy_arrayof* array, tommy_count_t count)
{
	if (array->count >= count)
		return;
	array->count = count;

	while (count > array->bucket_max) {
		unsigned char* segment;

		/* allocate one more segment */
		segment = tommy_cast(unsigned char*, tommy_calloc(array->bucket_max, array->element_size));

		/* store it adjusting the offset */
		/* cast to ptrdiff_t to ensure to get a negative value */
		array->bucket[array->bucket_bit] = segment - (tommy_ptrdiff_t)array->bucket_max * array->element_size;

		++array->bucket_bit;
		array->bucket_max = 1 << array->bucket_bit;
	}
}